

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

bool __thiscall
QNativeSocketEngine::setMulticastInterface(QNativeSocketEngine *this,QNetworkInterface *iface)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  bool bVar2;
  
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    setMulticastInterface();
  }
  else {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
      bVar2 = QNativeSocketEnginePrivate::nativeSetMulticastInterface(this_00,iface);
      return bVar2;
    }
    setMulticastInterface();
  }
  return false;
}

Assistant:

bool QNativeSocketEngine::setMulticastInterface(const QNetworkInterface &iface)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::setMulticastInterface(), false);
    Q_CHECK_TYPE(QNativeSocketEngine::setMulticastInterface(), QAbstractSocket::UdpSocket, false);
    return d->nativeSetMulticastInterface(iface);
}